

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O0

bool mg::data::nxcx_decompress(Nxx *header,uint8_t *data,string *out)

{
  uint uVar1;
  int err2;
  int err;
  z_stream istream;
  string *out_local;
  uint8_t *data_local;
  Nxx *header_local;
  
  istream.reserved = (uLong)out;
  std::__cxx11::string::resize((ulong)out);
  memset(&err2,0,0x70);
  istream.next_in._0_4_ = header->compressed_size;
  istream.next_out._0_4_ = header->size;
  _err2 = data;
  istream.total_in = std::__cxx11::string::data();
  istream.avail_out = 0;
  istream._36_4_ = 0;
  inflateInit_(&err2,"1.2.11",0x70);
  uVar1 = inflate(&err2,4);
  if ((uVar1 == 1) || (uVar1 == 0)) {
    uVar1 = inflateEnd(&err2);
    if (uVar1 == 0) {
      header_local._7_1_ = true;
    }
    else {
      fprintf(_stderr,"zlib error: %d: %s\n",(ulong)uVar1,istream.total_out);
      header_local._7_1_ = false;
    }
  }
  else {
    fprintf(_stderr,"zlib error: %d: %s\n",(ulong)uVar1,istream.total_out);
    header_local._7_1_ = false;
  }
  return header_local._7_1_;
}

Assistant:

bool nxcx_decompress(const Nxx &header, const uint8_t *data, std::string &out) {
  // Expand output to hold data
  out.resize(header.size);

  // Create inflate stream
  z_stream istream{};
  istream.avail_in = header.compressed_size;
  istream.next_in = const_cast<uint8_t *>(data);
  istream.avail_out = header.size;
  istream.next_out = reinterpret_cast<uint8_t *>(out.data());
  istream.total_out = 0;

  // Perform inflation
  inflateInit(&istream);
  const int err = inflate(&istream, Z_FINISH);
  if (err != Z_STREAM_END && err != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }
  const int err2 = inflateEnd(&istream);
  if (err2 != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err2, istream.msg);
    return false;
  }

  return true;
}